

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

int XMLSearch_init_from_XPath(SXML_CHAR *xpath,XMLSearch *search)

{
  SXML_CHAR SVar1;
  SXML_CHAR *pSVar2;
  SXML_CHAR *pSVar3;
  int iVar4;
  char *__ptr;
  bool bVar5;
  SXML_CHAR c;
  SXML_CHAR *tag0;
  SXML_CHAR *tag;
  SXML_CHAR *p;
  XMLSearch *search2;
  XMLSearch *search1;
  XMLSearch *search_local;
  SXML_CHAR *xpath_local;
  
  iVar4 = XMLSearch_init(search);
  if (iVar4 == 0) {
    xpath_local._4_4_ = 0;
  }
  else if ((xpath == (SXML_CHAR *)0x0) || (*xpath == '\0')) {
    xpath_local._4_4_ = 1;
  }
  else {
    search2 = (XMLSearch *)0x0;
    __ptr = strdup(xpath);
    tag0 = __ptr;
    p = (SXML_CHAR *)search;
    while (*tag0 != '\0') {
      if (((XMLSearch *)p != search) && (p = (SXML_CHAR *)calloc(1,0x40), p == (SXML_CHAR *)0x0)) {
        free(__ptr);
        XMLSearch_free(search,1);
        return 0;
      }
      while( true ) {
        bVar5 = false;
        if (*tag0 != '\0') {
          bVar5 = *tag0 == '/';
        }
        if (!bVar5) break;
        tag0 = tag0 + 1;
      }
      pSVar3 = tag0;
      if (*tag0 == '\0') {
        free(__ptr);
        return 0;
      }
      do {
        pSVar2 = pSVar3;
        tag = pSVar2 + 1;
        bVar5 = false;
        if (*tag != '\0') {
          bVar5 = *tag != '/';
        }
      } while ((bVar5) &&
              ((pSVar3 = tag, *tag != '\\' || (tag = pSVar2 + 2, pSVar3 = tag, pSVar2[2] != '\0'))))
      ;
      SVar1 = *tag;
      *tag = '\0';
      iVar4 = _init_search_from_1XPath(tag0,(XMLSearch *)p);
      if (iVar4 == 0) {
        free(__ptr);
        XMLSearch_free(search,1);
        return 0;
      }
      *tag = SVar1;
      if (search2 != (XMLSearch *)0x0) {
        search2->next = (_XMLSearch *)p;
      }
      if ((XMLSearch *)p != search) {
        *(XMLSearch **)(p + 0x28) = search2;
      }
      search2 = (XMLSearch *)p;
      p = (SXML_CHAR *)0x0;
      tag0 = tag;
    }
    free(__ptr);
    xpath_local._4_4_ = 1;
  }
  return xpath_local._4_4_;
}

Assistant:

int XMLSearch_init_from_XPath(const SXML_CHAR* xpath, XMLSearch* search)
{
	XMLSearch *search1, *search2;
	SXML_CHAR *p, *tag, *tag0;
	SXML_CHAR c;

	if (!XMLSearch_init(search))
		return FALSE;

	/* NULL or empty xpath is an empty (initialized only) search */
	if (xpath == NULL || *xpath == NULC)
		return TRUE;

	search1 = NULL;		/* Search struct to add the xpath portion to */
	search2 = search;	/* Search struct to be filled from xpath portion */

	tag = tag0 = sx_strdup(xpath); /* Create a copy of 'xpath' to be able to patch it (or segfault if 'xpath' is const, cnacu6o Sergey@sourceforge!) */
	while (*tag != NULC) {
		if (search2 != search) { /* Allocate a new search when the original one (i.e. 'search') has already been filled */
			search2 = (XMLSearch*)__calloc(1, sizeof(XMLSearch));
			if (search2 == NULL) {
				__free(tag0);
				(void)XMLSearch_free(search, TRUE);
				return FALSE;
			}
		}
		/* Skip all first '/' */
		for (; *tag != NULC && *tag == C2SX('/'); tag++) ;
		if (*tag == NULC) {
			__free(tag0);
			return FALSE;
		}

		/* Look for the end of tag name: after '/' (to get another tag) or end of string */
		for (p = &tag[1]; *p != NULC && *p != C2SX('/'); p++) {
			if (*p == C2SX('\\') && *++p == NULC)
				break; /* Escape character, '\' could be the last character... */
		}
		c = *p; /* Backup character before nulling it */
		*p = NULC;
		if (!_init_search_from_1XPath(tag, search2)) {
			__free(tag0);
			(void)XMLSearch_free(search, TRUE);
			return FALSE;
		}
		*p = c;

		/* 'search2' is the newly parsed tag, 'search1' is the previous tag (or NULL if 'search2' is the first tag to parse (i.e. 'search2' == 'search') */

		if (search1 != NULL) search1->next = search2;
		if (search2 != search) search2->prev = search1;
		search1 = search2;
		search2 = NULL; /* Will force allocation during next loop */
		tag = p;
	}

	__free(tag0);
	return TRUE;
}